

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processes.cxx
# Opt level: O1

void __thiscall Scalar::Scalar(Scalar *this,double d,string *name,string *type)

{
  string local_38;
  
  StochasticProcess::StochasticProcess((StochasticProcess *)this,(Time *)0x0,name,type);
  (this->super_StochasticFunction).super_StochasticProcess.super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__StochasticProcess_0015e528;
  (this->super_StochasticFunction).super_StochasticProcess.super_TimeDependent._vptr_TimeDependent =
       (_func_int **)&PTR__Scalar_0015e5d8;
  (this->super_StochasticFunction).super_StochasticProcess.super_Physical._vptr_Physical =
       (_func_int **)&PTR__Scalar_0015e620;
  this->scalarValue = d;
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->super_StochasticFunction).super_StochasticProcess.super_Physical.
              physicalDescription);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_StochasticFunction).super_StochasticProcess.stochDescription,0,
             (char *)(this->super_StochasticFunction).super_StochasticProcess.stochDescription.
                     _M_string_length,0x14e1d8);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"value","");
  Parametric::addParameter((Parametric *)this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

Scalar::Scalar(double d, const string& name, const string& type)
	: StochasticFunction(0, name, type)
{
	scalarValue = d;
	physicalDescription = name;
	stochDescription = "scalar";
	addParameter("value");
}